

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_range.h
# Opt level: O2

void __thiscall
llvm::iterator_range<llvm::DWARFDebugNames::ValueIterator>::iterator_range
          (iterator_range<llvm::DWARFDebugNames::ValueIterator> *this,ValueIterator *begin_iterator,
          ValueIterator *end_iterator)

{
  DWARFDebugNames::ValueIterator::ValueIterator(&this->begin_iterator,begin_iterator);
  DWARFDebugNames::ValueIterator::ValueIterator(&this->end_iterator,end_iterator);
  return;
}

Assistant:

iterator_range(IteratorT begin_iterator, IteratorT end_iterator)
      : begin_iterator(std::move(begin_iterator)),
        end_iterator(std::move(end_iterator)) {}